

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakSponge.c
# Opt level: O0

int InitSponge(spongeState *state,uint rate,uint capacity)

{
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  undefined4 local_4;
  
  if (in_ESI + in_EDX == 0x640) {
    if (((in_ESI == 0) || (0x63f < in_ESI)) || ((in_ESI & 0x3f) != 0)) {
      local_4 = 1;
    }
    else {
      KeccakInitialize();
      *(uint *)(in_RDI + 0x188) = in_ESI;
      *(int *)(in_RDI + 0x18c) = in_EDX;
      *(undefined4 *)(in_RDI + 0x194) = 0;
      KeccakInitializeState((uchar *)0x617c40);
      memset((void *)(in_RDI + 200),0,0xc0);
      *(undefined4 *)(in_RDI + 400) = 0;
      *(undefined4 *)(in_RDI + 0x198) = 0;
      *(undefined4 *)(in_RDI + 0x19c) = 0;
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int InitSponge(spongeState *state, unsigned int rate, unsigned int capacity)
{
    if (rate+capacity != 1600)
        return 1;
    if ((rate <= 0) || (rate >= 1600) || ((rate % 64) != 0))
        return 1;
    KeccakInitialize();
    state->rate = rate;
    state->capacity = capacity;
    state->fixedOutputLength = 0;
    KeccakInitializeState(state->state);
    memset(state->dataQueue, 0, KeccakMaximumRateInBytes);
    state->bitsInQueue = 0;
    state->squeezing = 0;
    state->bitsAvailableForSqueezing = 0;

    return 0;
}